

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# support.c
# Opt level: O1

int shiftcnt(uint32_t x)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar2 = 0;
  if ((x & 1) == 0 && x != 0) {
    uVar1 = 0;
    do {
      uVar2 = uVar1 + 1;
      if (0x1e < uVar1) {
        return uVar2;
      }
      uVar3 = x & 2;
      uVar1 = uVar2;
      x = x >> 1;
    } while (uVar3 == 0);
  }
  return uVar2;
}

Assistant:

int shiftcnt(uint32_t x)
/* returns number of 0-bits before the first 1-bit - something like */
/* an integer-log2() function - returns 0 on x=0 */
{
  int i;

  if (x == 0)
    return 0;
  for (i=0; i<32; i++) {
    if (x & 1)
      break;
    x >>= 1;
  }
  return i;
}